

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_test.cc
# Opt level: O0

void __thiscall DebugTest_CanBeChained_Test::TestBody(DebugTest_CanBeChained_Test *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  AssertionResult gtest_ar;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  Debug *this_00;
  string *this_01;
  AssertHelper in_stack_ffffffffffffff38;
  Message local_c0;
  string local_b8 [32];
  string local_98 [32];
  AssertionResult local_78;
  string local_68 [48];
  string local_38 [32];
  Debug local_18;
  
  this_00 = &local_18;
  Debug::Debug(this_00,(int)in_RDI[0xd]._M_string_length,(ostream *)(in_RDI->field_2)._M_local_buf);
  this_01 = local_38;
  std::__cxx11::string::string(this_01,(string *)&in_RDI[0xc]._M_string_length);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          Debug::operator<<(this_00,in_RDI);
  std::__cxx11::string::string(local_68,(string *)&in_RDI[0xc]._M_string_length);
  Debug::operator<<(this_00,in_RDI);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_38);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff38.data_,__rhs);
  std::__cxx11::ostringstream::str();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)this_01,(char *)this_00,in_RDI,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_78);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x1d7a11);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/debug_test.cc"
               ,0x12,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff38,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff38);
    testing::Message::~Message((Message *)0x1d7a5d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d7aac);
  return;
}

Assistant:

TEST_F(DebugTest, CanBeChained) {
  Debug(max_debug_level, oss) << str << str;
  EXPECT_EQ(str + str, oss.str());
}